

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view input)

{
  string_view input_00;
  Nullable<const_char_*> failure_msg;
  _anonymous_namespace_ *p_Var1;
  size_t local_48;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
  in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (p_Var1 = (_anonymous_namespace_ *)0x0; this != p_Var1; p_Var1 = p_Var1 + 1) {
    if (p_Var1[input._M_len] != (_anonymous_namespace_)0x5f) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  input_00._M_str = in_stack_ffffffffffffffc8;
  input_00._M_len = (size_t)in_stack_ffffffffffffffc0._M_head_impl;
  local_48 = anon_unknown_24::JsonNameSize(input_00);
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                          (&local_48,(unsigned_long *)&stack0xffffffffffffffc8,
                           "JsonNameSize(input) == result.size()");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x98,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_48);
}

Assistant:

std::string ToJsonName(const absl::string_view input) {
  bool capitalize_next = false;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(absl::ascii_toupper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  ABSL_DCHECK_EQ(JsonNameSize(input), result.size());

  return result;
}